

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileListFallback::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
               (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  size_type *psVar1;
  FunctionData *pFVar2;
  uint64_t uVar3;
  reference q_00;
  idx_t n;
  idx_t iVar4;
  unsigned_long *q;
  size_type *psVar5;
  RESULT_TYPE RVar6;
  QuantileDirect<duckdb::string_t> local_81;
  list_entry_t *local_80;
  AggregateFinalizeData *local_78;
  FunctionData *local_70;
  uint64_t local_68;
  Vector *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    local_60 = (Vector *)duckdb::ListVector::GetEntry(finalize_data->result);
    uVar3 = duckdb::ListVector::GetListSize(finalize_data->result);
    local_70 = pFVar2 + 8;
    local_78 = finalize_data;
    duckdb::ListVector::Reserve
              (finalize_data->result,
               (*(long *)(pFVar2 + 0x10) - *(long *)(pFVar2 + 8)) / 0x68 + uVar3);
    target->offset = uVar3;
    psVar1 = *(size_type **)(pFVar2 + 0x28);
    iVar4 = 0;
    local_80 = target;
    local_68 = uVar3;
    for (psVar5 = *(size_type **)(pFVar2 + 0x20); psVar5 != psVar1; psVar5 = psVar5 + 1) {
      q_00 = vector<duckdb::QuantileValue,_true>::get<true>
                       ((vector<duckdb::QuantileValue,_true> *)local_70,*psVar5);
      n = (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state->v).super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
      local_58.desc = *(bool *)(pFVar2 + 0x38);
      local_58.FRN = Interpolator<true>::Index(q_00,n);
      local_58.CRN = local_58.FRN;
      local_58.begin = iVar4;
      local_58.end = n;
      RVar6 = Interpolator<true>::
              InterpolateInternal<duckdb::string_t,duckdb::QuantileDirect<duckdb::string_t>>
                        (&local_58,
                         (state->v).
                         super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                         super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_81);
      duckdb::CreateSortKeyHelpers::DecodeSortKey
                ((string_t)RVar6.value,local_60,*psVar5 + local_68,(OrderModifiers)0x302);
      iVar4 = local_58.FRN;
    }
    uVar3 = (*(long *)(pFVar2 + 0x10) - *(long *)(pFVar2 + 8)) / 0x68;
    local_80->length = uVar3;
    duckdb::ListVector::SetListSize(local_78->result,uVar3 + local_80->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());

		D_ASSERT(state.v.data());

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<true> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			auto interpolation_result = interp.InterpolateInternal<string_t>(state.v.data());
			CreateSortKeyHelpers::DecodeSortKey(interpolation_result, result, ridx + q,
			                                    OrderModifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST));
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}